

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O0

void mxx::impl::
     distribute_container<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
     ::distribute_inplace
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *c,comm *comm)

{
  comm *pcVar1;
  bool bVar2;
  int iVar3;
  uint comm_size;
  uint comm_rank;
  int rank;
  unsigned_long uVar4;
  iterator begin;
  iterator end;
  iterator out;
  size_t sVar5;
  iterator __first;
  iterator __last;
  long lVar6;
  reference ppVar7;
  size_t sVar8;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_140;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_138;
  unsigned_long *local_130;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_128;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_120;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_118;
  unsigned_long *local_110;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_108;
  undefined1 local_100 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  undefined1 local_c0 [8];
  vector<long,_std::allocator<long>_> surpluses;
  signed_size_t surplus;
  undefined1 local_88 [8];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> result;
  undefined1 local_60 [8];
  blk_dist part;
  size_t total_size;
  size_t local_size;
  comm *comm_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *c_local;
  
  local_size = (size_t)comm;
  comm_local = (comm *)c;
  iVar3 = mxx::comm::size(comm);
  if (iVar3 != 1) {
    total_size = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                           ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            comm_local);
    uVar4 = allreduce<unsigned_long>(&total_size,(comm *)local_size);
    part.div1mod = uVar4;
    comm_size = mxx::comm::size((comm *)local_size);
    comm_rank = mxx::comm::rank((comm *)local_size);
    blk_dist_buf::blk_dist_buf((blk_dist_buf *)local_60,uVar4,comm_size,comm_rank);
    bVar2 = any_of(total_size == part.div1mod,(comm *)local_size);
    sVar8 = total_size;
    if (bVar2) {
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_88);
      sVar8 = blk_dist_buf::local_size((blk_dist_buf *)local_60);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_88,
                 sVar8);
      begin = std::begin<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         comm_local);
      end = std::end<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       comm_local);
      out = std::begin<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       local_88);
      distribute_scatter<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )begin._M_current,
                 (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )end._M_current,
                 (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )out._M_current,part.div1mod,(comm *)local_size);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::swap
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)comm_local,
                 (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_88);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_88);
    }
    else {
      sVar5 = blk_dist_buf::local_size((blk_dist_buf *)local_60);
      surpluses.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)(sVar8 - sVar5);
      allgather<long>((vector<long,_std::allocator<long>_> *)local_c0,
                      (long *)&surpluses.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(comm *)local_size);
      __first = std::vector<long,_std::allocator<long>_>::begin
                          ((vector<long,_std::allocator<long>_> *)local_c0);
      __last = std::vector<long,_std::allocator<long>_>::end
                         ((vector<long,_std::allocator<long>_> *)local_c0);
      lVar6 = std::
              accumulate<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
                        ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                         __first._M_current,
                         (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                         __last._M_current,0);
      if (lVar6 != 0) {
        assert_fail("std::accumulate(surpluses.begin(), surpluses.end(), static_cast<impl::signed_size_t>(0)) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/distribution.hpp"
                    ,0x147,"distribute_inplace");
      }
      iVar3 = mxx::comm::size((comm *)local_size);
      rank = mxx::comm::rank((comm *)local_size);
      surplus_send_pairing
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<long,_std::allocator<long>_> *)local_c0,iVar3,rank,false);
      all2all<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(comm *)local_size);
      if ((long)surpluses.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage < 1) {
        local_128._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &recv_counts.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
        local_130 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &recv_counts.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
        uVar4 = std::
                accumulate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                          (local_128,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            )local_130,0);
        if (uVar4 != 0) {
          assert_fail("std::accumulate(send_counts.begin(), send_counts.end(), static_cast<size_t>(0)) == 0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/distribution.hpp"
                      ,0x153,"distribute_inplace");
        }
        pcVar1 = comm_local;
        sVar8 = blk_dist_buf::local_size((blk_dist_buf *)local_60);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)pcVar1,
                   sVar8);
        local_140._M_current =
             (pair<int,_int> *)
             std::begin<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        comm_local);
        local_138 = __gnu_cxx::
                    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    ::operator+(&local_140,total_size);
        ppVar7 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*(&local_138);
        all2allv<std::pair<int,int>>
                  ((pair<int,_int> *)0x0,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,ppVar7,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100,
                   (comm *)local_size);
      }
      else {
        local_108._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100);
        local_110 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100);
        uVar4 = std::
                accumulate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                          (local_108,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            )local_110,0);
        if (uVar4 != 0) {
          assert_fail("std::accumulate(recv_counts.begin(), recv_counts.end(), static_cast<size_t>(0)) == 0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/distribution.hpp"
                      ,0x14e,"distribute_inplace");
        }
        local_120._M_current =
             (pair<int,_int> *)
             std::begin<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        comm_local);
        local_118 = __gnu_cxx::
                    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    ::operator+(&local_120,
                                total_size -
                                (long)surpluses.super__Vector_base<long,_std::allocator<long>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage);
        ppVar7 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*(&local_118);
        all2allv<std::pair<int,int>>
                  (ppVar7,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &recv_counts.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,(pair<int,_int> *)0x0,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100,
                   (comm *)local_size);
        pcVar1 = comm_local;
        sVar8 = blk_dist_buf::local_size((blk_dist_buf *)local_60);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)pcVar1,
                   sVar8);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)local_c0);
    }
    blk_dist_buf::~blk_dist_buf((blk_dist_buf *)local_60);
  }
  return;
}

Assistant:

inline static void distribute_inplace(Container& c, const mxx::comm& comm) {
        // custom implementation: don't need full sized buffers, only for receiving surpluses)
        // if single process, don't do anything
        if (comm.size() == 1)
            return;

        typedef typename std::iterator_traits<decltype(std::begin(c))>::value_type T;

        // get sizes
        size_t local_size = c.size();
        size_t total_size = mxx::allreduce(local_size, comm);
        blk_dist part(total_size, comm.size(), comm.rank());

        if (mxx::any_of(local_size == total_size, comm)) {
            // use scatterv instead of all2all based communication
            Container result;
            result.resize(part.local_size());
            impl::distribute_scatter(std::begin(c), std::end(c), std::begin(result), total_size, comm);
            c.swap(result);
        } else {
            // use surplus send-pairing to minimize total communication volume
            // TODO: use all2all or send/recv depending on the maximum number of
            //       paired processes

            // get surplus
            impl::signed_size_t surplus = (impl::signed_size_t)local_size - (impl::signed_size_t)part.local_size();

            // allgather surpluses
            // TODO figure out how to do surplus send pairing without requiring allgather
            std::vector<impl::signed_size_t> surpluses = mxx::allgather(surplus, comm);
            MXX_ASSERT(std::accumulate(surpluses.begin(), surpluses.end(), static_cast<impl::signed_size_t>(0)) == 0);

            // get send counts
            std::vector<size_t> send_counts = impl::surplus_send_pairing(surpluses, comm.size(), comm.rank(), false);
            std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);

            if (surplus > 0) {
                MXX_ASSERT(std::accumulate(recv_counts.begin(), recv_counts.end(), static_cast<size_t>(0)) == 0);
                // TODO: use iterators not pointers
                mxx::all2allv(&(*(std::begin(c)+((impl::signed_size_t)local_size-surplus))), send_counts, (T*)nullptr, recv_counts, comm);
                c.resize(part.local_size());
            } else {
                MXX_ASSERT(std::accumulate(send_counts.begin(), send_counts.end(), static_cast<size_t>(0)) == 0);
                c.resize(part.local_size());
                mxx::all2allv((T*)nullptr, send_counts, &(*(std::begin(c)+local_size)), recv_counts, comm);
            }
        }
    }